

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

void chmgr_sync_process(chmgr *chmgr)

{
  char local_118 [8];
  char buf [256];
  int n;
  chmgr *chmgr_local;
  
  if (chmgr->heartbeat < 5) {
    buf._252_4_ = snprintf(local_118,0x100,"\n\n\n%s -r %d\n",chmgr->server,
                           (ulong)(uint)chmgr->baudrate);
    write(chmgr->fds[0x1f].fd,local_118,(long)(int)buf._252_4_);
    chmgr->heartbeat = 0x14;
  }
  else if (chmgr->heartbeat < 10) {
    fm_write(chmgr,0x83,(void *)0x0,0);
  }
  chmgr->heartbeat = chmgr->heartbeat + -1;
  return;
}

Assistant:

static void chmgr_sync_process(struct chmgr *chmgr)
{
#if defined(MUXT)
    int n;
    char buf[256];
    if(chmgr->heartbeat < 5) {
        n = snprintf(buf, 256, "\n\n\n%s -r %d\n", chmgr->server, chmgr->baudrate);
        write(chmgr->fds[CTRL_PHYSIAL].fd, buf, n);
        chmgr->heartbeat = 20;
    } else
#endif
    if(chmgr->heartbeat < 10) {
        fm_write(chmgr, CTRL_HEARTBEAT, NULL, 0);
    } 
    chmgr->heartbeat--;
}